

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmsio.c
# Opt level: O3

int FmsIOGetInt(FmsIOContext *ctx,char *path,FmsInt *value)

{
  int iVar1;
  int iVar2;
  ulonglong uVar3;
  int *piVar4;
  char v [512];
  char k [512];
  char acStack_418 [512];
  char local_218 [520];
  
  if (ctx == (FmsIOContext *)0x0) {
    return 1;
  }
  if (path == (char *)0x0) {
    iVar2 = 2;
  }
  else if (value == (FmsInt *)0x0) {
    iVar2 = 3;
  }
  else {
    iVar1 = FmsIOReadKeyValue((FmsIOContext *)ctx->fp,local_218,acStack_418);
    iVar2 = 4;
    if (iVar1 == 0) {
      iVar1 = strcmp(local_218,path);
      iVar2 = 5;
      if (iVar1 == 0) {
        uVar3 = strtoull(acStack_418,(char **)0x0,10);
        *value = uVar3;
        piVar4 = __errno_location();
        iVar1 = 7;
        if (*piVar4 != 0x16) {
          iVar1 = 0;
        }
        iVar2 = 6;
        if (*piVar4 != 0x22) {
          iVar2 = iVar1;
        }
      }
    }
  }
  return iVar2;
}

Assistant:

static int
FmsIOGetInt(FmsIOContext *ctx, const char *path, FmsInt *value) {
  char k[FMS_BUFFER_SIZE], v[FMS_BUFFER_SIZE];
  if(!ctx) E_RETURN(1);
  if(!path) E_RETURN(2);
  if(!value) E_RETURN(3);

  // Error reading line
  if(FmsIOReadKeyValue(ctx, k, v))
    E_RETURN(4);

  // Path & key do not match
  if(strcmp(k, path))
    E_RETURN(5);

  *value = StrToFmsInt(v, NULL, 10);

  // Potential errors
  if (errno == ERANGE) { E_RETURN(6); }
  if (errno == EINVAL) { E_RETURN(7); }

  return 0;
}